

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::t_formatter<spdlog::details::scoped_padder>::format
          (t_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  scoped_padder p;
  padding_info *in_stack_ffffffffffffffa8;
  memory_buf_t *in_stack_ffffffffffffffb0;
  format_int local_30;
  
  uVar1 = msg->thread_id | 1;
  lVar3 = 0x3f;
  if (uVar1 != 0) {
    for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  uVar2 = ((uint)lVar3 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  scoped_padder::scoped_padder
            ((scoped_padder *)&stack0xffffffffffffffa8,
             (ulong)((uVar2 + 1) -
                    (uint)(msg->thread_id <
                          *(ulong *)(fmt::v6::internal::basic_data<void>::zero_or_powers_of_10_64 +
                                    (ulong)uVar2 * 8))),&(this->super_flag_formatter).padinfo_,dest)
  ;
  local_30.str_ = fmt::v6::format_int::format_decimal(&local_30,msg->thread_id);
  lVar3 = (long)&local_30 - (long)local_30.str_;
  if (-0x16 < lVar3) {
    fmt::v6::internal::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_30.str_,local_30.str_ + lVar3 + 0x15);
    scoped_padder::~scoped_padder((scoped_padder *)&stack0xffffffffffffffa8);
    return;
  }
  fmt::v6::internal::assert_fail
            ((char *)in_stack_ffffffffffffffb0,0,(char *)in_stack_ffffffffffffffa8);
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }